

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPJacobi.cpp
# Opt level: O2

double __thiscall chrono::ChSolverPJacobi::Solve(ChSolverPJacobi *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  undefined1 auVar2 [16];
  ChConstraint *pCVar3;
  pointer ppCVar4;
  ChVariables *this_00;
  ChConstraint *pCVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  pointer ppCVar10;
  ulong uVar11;
  pointer ppCVar12;
  int iter;
  size_type __new_size;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double local_110;
  vector<double,_std::allocator<double>_> delta_gammas;
  void *local_d0;
  double gi_values [3];
  double old_lambda_friction [3];
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  this->maxviolation = 0.0;
  uVar9 = 0;
  while( true ) {
    ppCVar10 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    uVar11 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10 >> 3;
    if (uVar11 <= uVar9) break;
    (*ppCVar10[uVar9]->_vptr_ChConstraint[6])();
    uVar9 = uVar9 + 1;
  }
  iVar13 = 0;
  uVar9 = 0xffffffff;
  while( true ) {
    uVar15 = uVar9;
    uVar9 = uVar15 + 1;
    if (uVar11 <= uVar9) break;
    pCVar3 = ppCVar10[uVar9];
    if (pCVar3->mode == CONSTRAINT_FRIC) {
      gi_values[iVar13] = pCVar3->g_i;
      iVar13 = iVar13 + 1;
      if (iVar13 == 3) {
        dVar27 = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
        ppCVar10[uVar15 - 1]->g_i = dVar27;
        iVar13 = 0;
        ppCVar10[uVar15]->g_i = dVar27;
        pCVar3->g_i = dVar27;
      }
    }
  }
  uVar9 = 0;
  while( true ) {
    ppCVar4 = (sysd->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar11 = (ulong)uVar9;
    if ((ulong)((long)(sysd->vvariables).
                      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3) <= uVar11)
    break;
    this_00 = ppCVar4[uVar11];
    if (this_00->disabled == false) {
      ChVariables::Get_qb(&local_60,this_00);
      ChVariables::Get_fb(&local_48,
                          (sysd->vvariables).
                          super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11]);
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)
                 &delta_gammas,
                 &local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                );
      (*this_00->_vptr_ChVariables[4])
                (this_00,&local_60,
                 (Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)
                 &delta_gammas);
      Eigen::internal::handmade_aligned_free(local_d0);
    }
    uVar9 = uVar9 + 1;
  }
  ppCVar10 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  __new_size = (long)(sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar10 >> 3;
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    for (uVar9 = 0; uVar9 < __new_size; uVar9 = uVar9 + 1) {
      ppCVar10[uVar9]->l_i = 0.0;
    }
  }
  delta_gammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  delta_gammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  delta_gammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&delta_gammas,__new_size);
  uVar9 = 0;
  iVar13 = 0;
  do {
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <= (int)uVar9) {
      dVar27 = this->maxviolation;
      break;
    }
    this->maxviolation = 0.0;
    auVar26 = ZEXT864(0) << 0x40;
    ppCVar10 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_110 = 0.0;
    uVar11 = 0xffffffff;
    while( true ) {
      uVar14 = uVar11;
      dVar27 = auVar26._0_8_;
      ppCVar12 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      uVar11 = (ulong)((int)uVar14 + 1);
      if ((ulong)((long)ppCVar12 - (long)ppCVar10 >> 3) <= uVar11) break;
      if (ppCVar10[uVar11]->active == true) {
        (*ppCVar10[uVar11]->_vptr_ChConstraint[7])();
        pCVar3 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11];
        auVar20._8_8_ = 0;
        auVar20._0_8_ = pCVar3->cfm_i;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pCVar3->l_i;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar27 + pCVar3->b_i;
        auVar2 = vfmadd132sd_fma(auVar20,auVar28,auVar2);
        auVar20 = auVar2;
        (*pCVar3->_vptr_ChConstraint[0xc])();
        ppCVar10 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pCVar3 = ppCVar10[uVar11];
        auVar16._8_8_ = 0x8000000000000000;
        auVar16._0_8_ = 0x8000000000000000;
        auVar16 = vxorpd_avx512vl(auVar2,auVar16);
        dVar27 = pCVar3->l_i;
        dVar18 = ((this->super_ChIterativeSolverVI).m_omega / pCVar3->g_i) * auVar16._0_8_ + dVar27;
        if (pCVar3->mode == CONSTRAINT_FRIC) {
          old_lambda_friction[iVar13] = dVar27;
          pCVar3->l_i = dVar18;
          if (iVar13 == 0) {
            auVar7._8_8_ = 0x7fffffffffffffff;
            auVar7._0_8_ = 0x7fffffffffffffff;
            auVar16 = vandpd_avx512vl(auVar2,auVar7);
            uVar6 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar2,1);
            auVar17._8_8_ = auVar16._8_8_;
            auVar17._0_8_ = (ulong)!(bool)((byte)uVar6 & 1) * auVar16._0_8_;
            iVar13 = 1;
          }
          else {
            iVar13 = iVar13 + 1;
            auVar17 = SUB6416(ZEXT864(0),0);
            if (iVar13 == 3) {
              uVar15 = (int)uVar14 - 1;
              (*ppCVar10[uVar15]->_vptr_ChConstraint[0xb])();
              ppCVar10 = (sysd->vconstraints).
                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              dVar27 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = dVar27;
              pCVar3 = ppCVar10[uVar14];
              pCVar5 = ppCVar10[uVar11];
              dVar18 = ppCVar10[uVar15]->l_i;
              auVar21._8_8_ = 0;
              auVar21._0_8_ = dVar18;
              dVar19 = pCVar3->l_i;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = dVar19;
              dVar34 = pCVar5->l_i;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = dVar34;
              if ((dVar27 != 1.0) || (NAN(dVar27))) {
                dVar27 = 1.0 - dVar27;
                auVar41._8_8_ = 0;
                auVar41._0_8_ = dVar27 * old_lambda_friction[0];
                auVar2 = vfmadd213sd_fma(auVar21,auVar39,auVar41);
                auVar42._8_8_ = 0;
                auVar42._0_8_ = dVar27 * old_lambda_friction[1];
                auVar16 = vfmadd213sd_fma(auVar29,auVar39,auVar42);
                auVar40._8_8_ = 0;
                auVar40._0_8_ = dVar27 * old_lambda_friction[2];
                auVar20 = vfmadd213sd_fma(auVar35,auVar39,auVar40);
                dVar18 = auVar2._0_8_;
                ppCVar10[uVar15]->l_i = dVar18;
                dVar19 = auVar16._0_8_;
                pCVar3->l_i = dVar19;
                dVar34 = auVar20._0_8_;
                pCVar5->l_i = dVar34;
              }
              delta_gammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] = dVar18 - old_lambda_friction[0];
              delta_gammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] = dVar19 - old_lambda_friction[1];
              delta_gammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] = dVar34 - old_lambda_friction[2];
              iVar13 = 0;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = dVar34 - old_lambda_friction[2];
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar8._8_8_ = 0x7fffffffffffffff;
                auVar8._0_8_ = 0x7fffffffffffffff;
                auVar38._8_8_ = 0;
                auVar38._0_8_ = local_110;
                auVar22._8_8_ = 0;
                auVar22._0_8_ = dVar18 - old_lambda_friction[0];
                auVar2 = vandpd_avx(auVar22,auVar8);
                auVar30._8_8_ = 0;
                auVar30._0_8_ = dVar19 - old_lambda_friction[1];
                auVar16 = vandpd_avx(auVar30,auVar8);
                auVar2 = vmaxsd_avx(auVar38,auVar2);
                auVar16 = vmaxsd_avx(auVar2,auVar16);
                auVar2 = vandpd_avx(auVar36,auVar8);
                auVar2 = vmaxsd_avx(auVar16,auVar2);
                local_110 = auVar2._0_8_;
              }
              auVar17 = ZEXT816(0);
            }
          }
        }
        else {
          pCVar3->l_i = dVar18;
          (*pCVar3->_vptr_ChConstraint[0xb])();
          ppCVar10 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          dVar18 = (this->super_ChIterativeSolverVI).m_shlambda;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = dVar18;
          dVar19 = ppCVar10[uVar11]->l_i;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar19;
          if ((dVar18 != 1.0) || (NAN(dVar18))) {
            auVar37._8_8_ = 0;
            auVar37._0_8_ = dVar27 * (1.0 - dVar18);
            auVar2 = vfmadd213sd_fma(auVar23,auVar31,auVar37);
            dVar19 = auVar2._0_8_;
            ppCVar10[uVar11]->l_i = dVar19;
          }
          auVar32._8_8_ = 0x7fffffffffffffff;
          auVar32._0_8_ = 0x7fffffffffffffff;
          auVar17 = vandpd_avx(auVar32,auVar20);
          delta_gammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] = dVar19 - dVar27;
          if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dVar19 - dVar27;
            auVar2 = vandpd_avx(auVar24,auVar32);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = local_110;
            auVar2 = vmaxsd_avx(auVar33,auVar2);
            local_110 = auVar2._0_8_;
          }
        }
        auVar25._8_8_ = 0;
        auVar25._0_8_ = this->maxviolation;
        auVar2 = vmaxsd_avx(auVar25,auVar17);
        auVar26 = ZEXT1664(auVar2);
        this->maxviolation = auVar2._0_8_;
      }
    }
    for (uVar15 = 0; uVar11 = (ulong)uVar15, uVar11 < (ulong)((long)ppCVar12 - (long)ppCVar10 >> 3);
        uVar15 = uVar15 + 1) {
      if (ppCVar10[uVar11]->active == true) {
        (*ppCVar10[uVar11]->_vptr_ChConstraint[8])
                  (delta_gammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar11]);
        ppCVar10 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar12 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    dVar27 = this->maxviolation;
    if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
      ChIterativeSolverVI::AtIterationEnd(&this->super_ChIterativeSolverVI,dVar27,local_110,uVar9);
      dVar27 = this->maxviolation;
    }
    piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
    *piVar1 = *piVar1 + 1;
    uVar9 = uVar9 + 1;
  } while ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance <= dVar27);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&delta_gammas.super__Vector_base<double,_std::allocator<double>_>);
  return dVar27;
}

Assistant:

double ChSolverPJacobi::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    m_iterations = 0;
    maxviolation = 0;
    double maxdeltalambda = 0;
    int i_friction_comp = 0;
    double old_lambda_friction[3];

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:

    for (unsigned int iv = 0; iv < mvariables.size(); iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    //

    std::vector<double> delta_gammas;
    delta_gammas.resize(mconstraints.size());

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // The iteration on all constraints
        //

        maxviolation = 0;
        maxdeltalambda = 0;

        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;

                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V
                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        delta_gammas[ic - 2] = new_lambda_0 - old_lambda_friction[0];
                        delta_gammas[ic - 1] = new_lambda_1 - old_lambda_friction[1];
                        delta_gammas[ic - 0] = new_lambda_2 - old_lambda_friction[2];
                        // Now do NOT update the primal variables , posticipate
                        // mconstraints[xx]->Increment_q(true_delta_xx);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 2]));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 1]));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 0]));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    // Now do NOT update the primal variables , posticipate
                    // mconstraints[ic]->Increment_q(true_delta_xx);
                    delta_gammas[ic] = new_lambda - old_lambda;

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic]));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));
            }
        }

        // Now, after all deltas are updated, sweep through all constraints and increment  q += [invM][Cq]'* delta_l
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(delta_gammas[ic]);
        }

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        m_iterations++;

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;
    }

    return maxviolation;
}